

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

void ma_convert_pcm_frames_format
               (void *pOut,ma_format formatOut,void *pIn,ma_format formatIn,ma_uint64 frameCount,
               ma_uint32 channels,ma_dither_mode ditherMode)

{
  undefined4 uVar1;
  long lVar2;
  double dVar3;
  undefined1 uVar4;
  char cVar5;
  undefined2 uVar6;
  uint uVar7;
  ma_uint64 i;
  long lVar8;
  undefined2 uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  ma_lcg mVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  undefined2 uVar18;
  undefined1 *puVar19;
  undefined2 uVar20;
  ulong uVar21;
  ulong uVar22;
  float *src_f32;
  byte *pbVar23;
  char *pcVar24;
  undefined2 *puVar25;
  ulong uVar26;
  bool bVar27;
  double dVar28;
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  float fVar33;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar40;
  undefined1 auVar41 [12];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar44;
  undefined1 auVar45 [12];
  float fVar46;
  
  auVar39 = _DAT_001125c0;
  uVar26 = channels * frameCount;
  if (formatOut == formatIn) {
    memcpy(pOut,pIn,uVar26 * *(uint *)(&DAT_001127b0 + (ulong)formatOut * 4));
    return;
  }
  switch(formatIn) {
  case ma_format_u8:
    switch(formatOut) {
    case ma_format_s16:
      for (lVar8 = 0; uVar26 - lVar8 != 0; lVar8 = lVar8 + 1) {
        *(ushort *)((long)pOut + lVar8 * 2) = (ushort)*(byte *)((long)pIn + lVar8) << 8 ^ 0x8000;
      }
      break;
    case ma_format_s24:
      pcVar24 = (char *)((long)pOut + 2);
      for (lVar8 = 0; uVar26 - lVar8 != 0; lVar8 = lVar8 + 1) {
        cVar5 = *(char *)((long)pIn + lVar8);
        pcVar24[-2] = '\0';
        pcVar24[-1] = '\0';
        *pcVar24 = cVar5 + -0x80;
        pcVar24 = pcVar24 + 3;
      }
      break;
    case ma_format_s32:
      for (lVar8 = 0; uVar26 - lVar8 != 0; lVar8 = lVar8 + 1) {
        *(uint *)((long)pOut + lVar8 * 4) = (*(byte *)((long)pIn + lVar8) ^ 0xffffff80) << 0x18;
      }
      break;
    case ma_format_f32:
      for (lVar8 = 0; uVar26 - lVar8 != 0; lVar8 = lVar8 + 1) {
        *(float *)((long)pOut + lVar8 * 4) =
             (float)*(byte *)((long)pIn + lVar8) * 0.007843138 + -1.0;
      }
    }
    break;
  case ma_format_s16:
    switch(formatOut) {
    case ma_format_u8:
      if (ditherMode == ma_dither_mode_none) {
        for (lVar8 = 0; uVar26 - lVar8 != 0; lVar8 = lVar8 + 1) {
          *(char *)((long)pOut + lVar8) = *(char *)((long)pIn + lVar8 * 2 + 1) + -0x80;
        }
      }
      else {
        mVar13.state = g_maLCG.state;
        for (lVar8 = 0; uVar26 - lVar8 != 0; lVar8 = lVar8 + 1) {
          if (ditherMode == ma_dither_mode_triangle) {
            uVar21 = (long)(mVar13.state * 0xbc8f) % 0x7fffffff;
            uVar22 = (long)((int)uVar21 * 0xbc8f) % 0x7fffffff;
            mVar13.state = (ma_int32)uVar22;
            iVar10 = ((uint)(uVar22 >> 0x19) & 0x7f) + (int)((uVar21 & 0xffffffff) / 0x1fc07f1) +
                     -0x80;
            g_maLCG.state = mVar13.state;
          }
          else {
            iVar10 = 0;
            if (ditherMode == ma_dither_mode_rectangle) {
              lVar2 = (long)(mVar13.state * 0xbc8f) % 0x7fffffff;
              mVar13.state = (ma_int32)lVar2;
              iVar10 = ((uint)((ulong)lVar2 >> 0x18) & 0xff) - 0x80;
              g_maLCG.state = mVar13.state;
            }
          }
          iVar10 = iVar10 + *(short *)((long)pIn + lVar8 * 2);
          cVar5 = (char)((uint)iVar10 >> 8) + -0x80;
          if (0x7fff < iVar10) {
            cVar5 = -1;
          }
          *(char *)((long)pOut + lVar8) = cVar5;
        }
      }
      break;
    case ma_format_s24:
      puVar19 = (undefined1 *)((long)pOut + 2);
      for (lVar8 = 0; uVar26 - lVar8 != 0; lVar8 = lVar8 + 1) {
        puVar19[-2] = 0;
        puVar19[-1] = *(undefined1 *)((long)pIn + lVar8 * 2);
        *puVar19 = *(undefined1 *)((long)pIn + lVar8 * 2 + 1);
        puVar19 = puVar19 + 3;
      }
      break;
    case ma_format_s32:
      for (lVar8 = 0; uVar26 - lVar8 != 0; lVar8 = lVar8 + 1) {
        *(uint *)((long)pOut + lVar8 * 4) = (uint)*(ushort *)((long)pIn + lVar8 * 2) << 0x10;
      }
      break;
    case ma_format_f32:
      for (lVar8 = 0; uVar26 - lVar8 != 0; lVar8 = lVar8 + 1) {
        *(float *)((long)pOut + lVar8 * 4) =
             (float)(int)*(short *)((long)pIn + lVar8 * 2) * 3.0517578e-05;
      }
    }
    break;
  case ma_format_s24:
    switch(formatOut) {
    case ma_format_u8:
      if (ditherMode == ma_dither_mode_none) {
        pcVar24 = (char *)((long)pIn + 2);
        for (lVar8 = 0; uVar26 - lVar8 != 0; lVar8 = lVar8 + 1) {
          *(char *)((long)pOut + lVar8) = *pcVar24 + -0x80;
          pcVar24 = pcVar24 + 3;
        }
      }
      else {
        pbVar23 = (byte *)((long)pIn + 2);
        mVar13.state = g_maLCG.state;
        for (lVar8 = 0; uVar26 - lVar8 != 0; lVar8 = lVar8 + 1) {
          if (ditherMode == ma_dither_mode_triangle) {
            uVar21 = (long)(mVar13.state * 0xbc8f) % 0x7fffffff;
            uVar22 = (long)((int)uVar21 * 0xbc8f) % 0x7fffffff;
            mVar13.state = (ma_int32)uVar22;
            iVar10 = ((uint)(uVar22 >> 9) & 0x7fffff) + (int)((uVar21 & 0xffffffff) >> 9) +
                     -0x800000;
            g_maLCG.state = mVar13.state;
          }
          else {
            iVar10 = 0;
            if (ditherMode == ma_dither_mode_rectangle) {
              lVar2 = (long)(mVar13.state * 0xbc8f) % 0x7fffffff;
              mVar13.state = (ma_int32)lVar2;
              iVar10 = ((uint)((ulong)lVar2 >> 8) & 0xffffff) - 0x800000;
              g_maLCG.state = mVar13.state;
            }
          }
          uVar21 = (long)(int)((uint)*pbVar23 << 0x18) | (ulong)*(ushort *)(pbVar23 + -2) << 8;
          cVar5 = (char)((uint)(iVar10 + (int)uVar21) >> 0x18) + -0x80;
          if (0x7fffffff < (long)(uVar21 + (long)iVar10)) {
            cVar5 = -1;
          }
          *(char *)((long)pOut + lVar8) = cVar5;
          pbVar23 = pbVar23 + 3;
        }
      }
      break;
    case ma_format_s16:
      if (ditherMode == ma_dither_mode_none) {
        puVar25 = (undefined2 *)((long)pIn + 1);
        for (lVar8 = 0; uVar26 - lVar8 != 0; lVar8 = lVar8 + 1) {
          *(undefined2 *)((long)pOut + lVar8 * 2) = *puVar25;
          puVar25 = (undefined2 *)((long)puVar25 + 3);
        }
      }
      else {
        pbVar23 = (byte *)((long)pIn + 2);
        mVar13.state = g_maLCG.state;
        for (lVar8 = 0; uVar26 - lVar8 != 0; lVar8 = lVar8 + 1) {
          if (ditherMode == ma_dither_mode_triangle) {
            uVar21 = (long)(mVar13.state * 0xbc8f) % 0x7fffffff;
            uVar22 = (long)((int)uVar21 * 0xbc8f) % 0x7fffffff;
            mVar13.state = (ma_int32)uVar22;
            iVar10 = ((uint)(uVar22 >> 0x11) & 0x7fff) + (int)((uVar21 & 0xffffffff) / 0x1fffd) +
                     -0x8000;
            g_maLCG.state = mVar13.state;
          }
          else {
            iVar10 = 0;
            if (ditherMode == ma_dither_mode_rectangle) {
              lVar2 = (long)(mVar13.state * 0xbc8f) % 0x7fffffff;
              mVar13.state = (ma_int32)lVar2;
              iVar10 = ((uint)((ulong)lVar2 >> 0x10) & 0xffff) - 0x8000;
              g_maLCG.state = mVar13.state;
            }
          }
          uVar21 = (long)(int)((uint)*pbVar23 << 0x18) | (ulong)*(ushort *)(pbVar23 + -2) << 8;
          uVar6 = (undefined2)((uint)(iVar10 + (int)uVar21) >> 0x10);
          if (0x7fffffff < (long)(uVar21 + (long)iVar10)) {
            uVar6 = 0x7fff;
          }
          *(undefined2 *)((long)pOut + lVar8 * 2) = uVar6;
          pbVar23 = pbVar23 + 3;
        }
      }
      break;
    case ma_format_s32:
      pbVar23 = (byte *)((long)pIn + 2);
      for (lVar8 = 0; uVar26 - lVar8 != 0; lVar8 = lVar8 + 1) {
        *(uint *)((long)pOut + lVar8 * 4) =
             (uint)*pbVar23 << 0x18 | (uint)*(ushort *)(pbVar23 + -2) << 8;
        pbVar23 = pbVar23 + 3;
      }
      break;
    case ma_format_f32:
      pbVar23 = (byte *)((long)pIn + 2);
      for (lVar8 = 0; uVar26 - lVar8 != 0; lVar8 = lVar8 + 1) {
        *(float *)((long)pOut + lVar8 * 4) =
             (float)((int)((uint)*pbVar23 << 0x18 | (uint)*(ushort *)(pbVar23 + -2) << 8) >> 8) *
             1.1920929e-07;
        pbVar23 = pbVar23 + 3;
      }
    }
    break;
  case ma_format_s32:
    switch(formatOut) {
    case ma_format_u8:
      if (ditherMode == ma_dither_mode_none) {
        for (lVar8 = 0; uVar26 - lVar8 != 0; lVar8 = lVar8 + 1) {
          *(char *)((long)pOut + lVar8) = *(char *)((long)pIn + lVar8 * 4 + 3) + -0x80;
        }
      }
      else {
        mVar13.state = g_maLCG.state;
        for (lVar8 = 0; uVar26 - lVar8 != 0; lVar8 = lVar8 + 1) {
          iVar10 = *(int *)((long)pIn + lVar8 * 4);
          if (ditherMode == ma_dither_mode_triangle) {
            uVar21 = (long)(mVar13.state * 0xbc8f) % 0x7fffffff;
            uVar22 = (long)((int)uVar21 * 0xbc8f) % 0x7fffffff;
            mVar13.state = (ma_int32)uVar22;
            iVar11 = ((uint)(uVar22 >> 9) & 0x7fffff) + (int)((uVar21 & 0xffffffff) >> 9) +
                     -0x800000;
            g_maLCG.state = mVar13.state;
          }
          else {
            iVar11 = 0;
            if (ditherMode == ma_dither_mode_rectangle) {
              lVar2 = (long)(mVar13.state * 0xbc8f) % 0x7fffffff;
              mVar13.state = (ma_int32)lVar2;
              iVar11 = ((uint)((ulong)lVar2 >> 8) & 0xffffff) - 0x800000;
              g_maLCG.state = mVar13.state;
            }
          }
          cVar5 = (char)((uint)(iVar11 + iVar10) >> 0x18) + -0x80;
          if (0x7fffffff < (long)iVar10 + (long)iVar11) {
            cVar5 = -1;
          }
          *(char *)((long)pOut + lVar8) = cVar5;
        }
      }
      break;
    case ma_format_s16:
      if (ditherMode == ma_dither_mode_none) {
        for (lVar8 = 0; uVar26 - lVar8 != 0; lVar8 = lVar8 + 1) {
          *(undefined2 *)((long)pOut + lVar8 * 2) = *(undefined2 *)((long)pIn + lVar8 * 4 + 2);
        }
      }
      else {
        mVar13.state = g_maLCG.state;
        for (lVar8 = 0; uVar26 - lVar8 != 0; lVar8 = lVar8 + 1) {
          iVar10 = *(int *)((long)pIn + lVar8 * 4);
          if (ditherMode == ma_dither_mode_triangle) {
            uVar21 = (long)(mVar13.state * 0xbc8f) % 0x7fffffff;
            uVar22 = (long)((int)uVar21 * 0xbc8f) % 0x7fffffff;
            mVar13.state = (ma_int32)uVar22;
            iVar11 = ((uint)(uVar22 >> 0x11) & 0x7fff) + (int)((uVar21 & 0xffffffff) / 0x1fffd) +
                     -0x8000;
            g_maLCG.state = mVar13.state;
          }
          else {
            iVar11 = 0;
            if (ditherMode == ma_dither_mode_rectangle) {
              lVar2 = (long)(mVar13.state * 0xbc8f) % 0x7fffffff;
              mVar13.state = (ma_int32)lVar2;
              iVar11 = ((uint)((ulong)lVar2 >> 0x10) & 0xffff) - 0x8000;
              g_maLCG.state = mVar13.state;
            }
          }
          uVar6 = (undefined2)((uint)(iVar11 + iVar10) >> 0x10);
          if (0x7fffffff < (long)iVar10 + (long)iVar11) {
            uVar6 = 0x7fff;
          }
          *(undefined2 *)((long)pOut + lVar8 * 2) = uVar6;
        }
      }
      break;
    case ma_format_s24:
      puVar19 = (undefined1 *)((long)pOut + 2);
      for (lVar8 = 0; uVar26 - lVar8 != 0; lVar8 = lVar8 + 1) {
        uVar1 = *(undefined4 *)((long)pIn + lVar8 * 4);
        puVar19[-2] = (char)((uint)uVar1 >> 8);
        puVar19[-1] = (char)((uint)uVar1 >> 0x10);
        *puVar19 = (char)((uint)uVar1 >> 0x18);
        puVar19 = puVar19 + 3;
      }
      break;
    case ma_format_f32:
      for (lVar8 = 0; uVar26 - lVar8 != 0; lVar8 = lVar8 + 1) {
        *(float *)((long)pOut + lVar8 * 4) = (float)*(int *)((long)pIn + lVar8 * 4) * 4.656613e-10;
      }
    }
    break;
  case ma_format_f32:
    switch(formatOut) {
    case ma_format_u8:
      mVar13.state = g_maLCG.state;
      for (lVar8 = 0; uVar26 - lVar8 != 0; lVar8 = lVar8 + 1) {
        if (ditherMode == ma_dither_mode_triangle) {
          iVar10 = (mVar13.state * 0xbc8f) % 0x7fffffff;
          mVar13.state = (iVar10 * 0xbc8f) % 0x7fffffff;
          auVar36._0_8_ = (double)iVar10;
          auVar36._8_8_ = (double)mVar13.state;
          auVar32 = divpd(auVar36,auVar39);
          fVar29 = (float)auVar32._8_8_ * 0.007874016 + 0.0 +
                   (float)auVar32._0_8_ * 0.0078125 + -0.0078125;
          g_maLCG.state = mVar13.state;
        }
        else {
          fVar29 = 0.0;
          if (ditherMode == ma_dither_mode_rectangle) {
            mVar13.state = (mVar13.state * 0xbc8f) % 0x7fffffff;
            fVar29 = ((float)mVar13.state / 2.1474836e+09) * 0.015686516 + -0.0078125;
            g_maLCG.state = mVar13.state;
          }
        }
        fVar29 = *(float *)((long)pIn + lVar8 * 4) + fVar29;
        if (-1.0 <= fVar29) {
          fVar33 = 1.0;
          if (fVar29 <= 1.0) {
            fVar33 = fVar29;
          }
          uVar4 = (undefined1)(int)((fVar33 + 1.0) * 127.5);
        }
        else {
          uVar4 = 0;
        }
        *(undefined1 *)((long)pOut + lVar8) = uVar4;
      }
      break;
    case ma_format_s16:
      uVar22 = uVar26 >> 2;
      uVar21 = 0;
      mVar13.state = g_maLCG.state;
      while( true ) {
        auVar32 = _DAT_001125c0;
        bVar27 = uVar22 == 0;
        uVar22 = uVar22 - 1;
        if (bVar27) break;
        if (ditherMode == ma_dither_mode_triangle) {
          iVar10 = (mVar13.state * 0xbc8f) % 0x7fffffff;
          iVar11 = (iVar10 * 0xbc8f) % 0x7fffffff;
          iVar12 = (iVar11 * 0xbc8f) % 0x7fffffff;
          iVar14 = (iVar12 * 0xbc8f) % 0x7fffffff;
          iVar15 = (iVar14 * 0xbc8f) % 0x7fffffff;
          iVar16 = (iVar15 * 0xbc8f) % 0x7fffffff;
          iVar17 = (iVar16 * 0xbc8f) % 0x7fffffff;
          auVar32._0_8_ = (double)iVar15;
          auVar32._8_8_ = (double)iVar10;
          auVar42._0_8_ = (double)iVar12;
          auVar42._8_8_ = (double)iVar17;
          auVar42 = divpd(auVar42,auVar39);
          auVar32 = divpd(auVar32,auVar39);
          mVar13.state = (iVar17 * 0xbc8f) % 0x7fffffff;
          auVar38._0_8_ = (double)iVar16;
          auVar38._8_8_ = (double)iVar11;
          auVar43._0_8_ = (double)iVar14;
          auVar43._8_8_ = (double)mVar13.state;
          auVar38 = divpd(auVar38,auVar39);
          auVar43 = divpd(auVar43,auVar39);
          auVar30._0_4_ =
               (float)auVar38._0_8_ * 3.051851e-05 + 0.0 +
               (float)auVar32._0_8_ * 3.0517578e-05 + -3.0517578e-05;
          auVar30._4_4_ =
               (float)auVar38._8_8_ * 3.051851e-05 + 0.0 +
               (float)auVar32._8_8_ * 3.0517578e-05 + -3.0517578e-05;
          auVar30._8_4_ =
               (float)auVar43._0_8_ * 3.051851e-05 + 0.0 +
               (float)auVar42._0_8_ * 3.0517578e-05 + -3.0517578e-05;
          auVar30._12_4_ =
               (float)auVar43._8_8_ * 3.051851e-05 + 0.0 +
               (float)auVar42._8_8_ * 3.0517578e-05 + -3.0517578e-05;
          g_maLCG.state = mVar13.state;
        }
        else {
          auVar30 = ZEXT816(0);
          if (ditherMode == ma_dither_mode_rectangle) {
            iVar10 = (mVar13.state * 0xbc8f) % 0x7fffffff;
            iVar11 = (iVar10 * 0xbc8f) % 0x7fffffff;
            iVar12 = (iVar11 * 0xbc8f) % 0x7fffffff;
            mVar13.state = (iVar12 * 0xbc8f) % 0x7fffffff;
            auVar31._0_8_ = (double)iVar12;
            auVar31._8_8_ = (double)iVar10;
            auVar37._0_8_ = (double)iVar11;
            auVar37._8_8_ = (double)mVar13.state;
            auVar38 = divpd(auVar37,auVar39);
            auVar32 = divpd(auVar31,auVar39);
            auVar30._0_4_ = (float)auVar32._0_8_ * 6.103609e-05 + -3.0517578e-05;
            auVar30._4_4_ = (float)auVar32._8_8_ * 6.103609e-05 + -3.0517578e-05;
            auVar30._8_4_ = (float)auVar38._0_8_ * 6.103609e-05 + -3.0517578e-05;
            auVar30._12_4_ = (float)auVar38._8_8_ * 6.103609e-05 + -3.0517578e-05;
            g_maLCG.state = mVar13.state;
          }
        }
        fVar44 = auVar30._4_4_ + *(float *)((long)pIn + uVar21 * 4);
        fVar40 = auVar30._8_4_ + *(float *)((long)pIn + uVar21 * 4 + 4);
        fVar33 = *(float *)((long)pIn + uVar21 * 4 + 8) + auVar30._0_4_;
        fVar29 = auVar30._12_4_ + *(float *)((long)pIn + uVar21 * 4 + 0xc);
        uVar6 = 0x8001;
        uVar9 = 0x8001;
        if (-1.0 <= fVar44) {
          fVar46 = 1.0;
          if (fVar44 <= 1.0) {
            fVar46 = fVar44;
          }
          uVar9 = (undefined2)(int)(fVar46 * 32767.0);
        }
        if (-1.0 <= fVar40) {
          auVar45 = ZEXT812(0x3f800000);
          if (fVar40 <= 1.0) {
            auVar45._4_8_ = auVar45._4_8_;
            auVar45._0_4_ = fVar40;
          }
          uVar6 = (undefined2)(int)(auVar45._0_4_ * 32767.0);
        }
        uVar18 = 0x8001;
        uVar20 = 0x8001;
        if (-1.0 <= fVar33) {
          auVar41 = ZEXT812(0x3f800000);
          if (fVar33 <= 1.0) {
            auVar41._4_8_ = auVar41._4_8_;
            auVar41._0_4_ = fVar33;
          }
          uVar20 = (undefined2)(int)(auVar41._0_4_ * 32767.0);
        }
        if (-1.0 <= fVar29) {
          auVar34 = ZEXT812(0x3f800000);
          if (fVar29 <= 1.0) {
            auVar34._4_8_ = auVar34._4_8_;
            auVar34._0_4_ = fVar29;
          }
          uVar18 = (undefined2)(int)(auVar34._0_4_ * 32767.0);
        }
        *(undefined2 *)((long)pOut + uVar21 * 2) = uVar9;
        *(undefined2 *)((long)pOut + uVar21 * 2 + 2) = uVar6;
        *(undefined2 *)((long)pOut + uVar21 * 2 + 4) = uVar20;
        *(undefined2 *)((long)pOut + uVar21 * 2 + 6) = uVar18;
        uVar21 = uVar21 + 4;
      }
      for (; uVar21 < uVar26; uVar21 = uVar21 + 1) {
        if (ditherMode == ma_dither_mode_triangle) {
          iVar10 = (mVar13.state * 0xbc8f) % 0x7fffffff;
          mVar13.state = (iVar10 * 0xbc8f) % 0x7fffffff;
          auVar39._0_8_ = (double)iVar10;
          auVar39._8_8_ = (double)mVar13.state;
          auVar39 = divpd(auVar39,auVar32);
          fVar29 = (float)auVar39._8_8_ * 3.051851e-05 + 0.0 +
                   (float)auVar39._0_8_ * 3.0517578e-05 + -3.0517578e-05;
          g_maLCG.state = mVar13.state;
        }
        else {
          fVar29 = 0.0;
          if (ditherMode == ma_dither_mode_rectangle) {
            mVar13.state = (mVar13.state * 0xbc8f) % 0x7fffffff;
            fVar29 = ((float)mVar13.state / 2.1474836e+09) * 6.103609e-05 + -3.0517578e-05;
            g_maLCG.state = mVar13.state;
          }
        }
        fVar29 = *(float *)((long)pIn + uVar21 * 4) + fVar29;
        uVar6 = 0x8001;
        if (-1.0 <= fVar29) {
          auVar35 = ZEXT812(0x3f800000);
          if (fVar29 <= 1.0) {
            auVar35._4_8_ = auVar35._4_8_;
            auVar35._0_4_ = fVar29;
          }
          uVar6 = (undefined2)(int)(auVar35._0_4_ * 32767.0);
        }
        *(undefined2 *)((long)pOut + uVar21 * 2) = uVar6;
      }
      break;
    case ma_format_s24:
      puVar19 = (undefined1 *)((long)pOut + 2);
      for (lVar8 = 0; uVar26 - lVar8 != 0; lVar8 = lVar8 + 1) {
        fVar29 = *(float *)((long)pIn + lVar8 * 4);
        iVar10 = -0x7fffff;
        if (-1.0 <= fVar29) {
          fVar33 = 1.0;
          if (fVar29 <= 1.0) {
            fVar33 = fVar29;
          }
          iVar10 = (int)(fVar33 * 8388607.0);
        }
        puVar19[-2] = (char)iVar10;
        puVar19[-1] = (char)((uint)iVar10 >> 8);
        *puVar19 = (char)((uint)iVar10 >> 0x10);
        puVar19 = puVar19 + 3;
      }
      break;
    case ma_format_s32:
      for (uVar7 = 0; uVar21 = (ulong)uVar7, uVar21 <= uVar26 && uVar26 - uVar21 != 0;
          uVar7 = uVar7 + 1) {
        fVar29 = *(float *)((long)pIn + uVar21 * 4);
        iVar10 = -0x7fffffff;
        if (-1.0 <= fVar29) {
          dVar3 = (double)fVar29;
          dVar28 = 1.0;
          if (dVar3 <= 1.0) {
            dVar28 = dVar3;
          }
          iVar10 = (int)(dVar28 * 2147483647.0);
        }
        *(int *)((long)pOut + uVar21 * 4) = iVar10;
      }
    }
  }
  return;
}

Assistant:

MA_API void ma_convert_pcm_frames_format(void* pOut, ma_format formatOut, const void* pIn, ma_format formatIn, ma_uint64 frameCount, ma_uint32 channels, ma_dither_mode ditherMode)
{
    ma_pcm_convert(pOut, formatOut, pIn, formatIn, frameCount * channels, ditherMode);
}